

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::Lodeangle(TPZTensor<double> *this,TPZTensor<double> *GradLode,double *Lode)

{
  REAL RVar1;
  double dVar2;
  double *in_RDX;
  TPZTensor<double> *in_RDI;
  double acoslodetemp;
  double oneoverden;
  double denom;
  double checknegativeroot;
  double j22;
  double j33;
  double lodetemp;
  TPZTensor<double> TempTensor;
  TPZTensor<double> dLodeAngle;
  TPZTensor<double> dJ3t;
  TPZTensor<double> dJ2t;
  double sqrtJ2t;
  double J3t;
  double J2t;
  double *multipl;
  TPZTensor<double> *in_stack_fffffffffffffde0;
  TPZTensor<double> *pTVar3;
  TPZTensor<double> *tensor;
  TPZTensor<double> *this_00;
  TPZTensor<double> *in_stack_fffffffffffffe10;
  double local_1d0;
  TPZTensor<double> *in_stack_fffffffffffffe40;
  double local_1a8;
  TPZTensor<double> *in_stack_fffffffffffffed0;
  TPZTensor<double> *this_01;
  
  this_01 = (TPZTensor<double> *)J2(in_stack_fffffffffffffed0);
  pTVar3 = (TPZTensor<double> *)J3(in_stack_fffffffffffffe40);
  RVar1 = TPZExtractVal::val((double)this_01);
  if (ABS(RVar1) < 1e-06) {
    this_01 = (TPZTensor<double> *)0x3eb0c6f7a0b5ed8d;
  }
  dVar2 = sqrt((double)this_01);
  TPZExtractVal::val(dVar2);
  TPZTensor(in_stack_fffffffffffffde0);
  TPZTensor(in_stack_fffffffffffffde0);
  dJ2(in_stack_fffffffffffffe10,in_RDI);
  dJ3(this_01,pTVar3);
  TPZTensor(in_stack_fffffffffffffde0);
  TPZTensor(in_stack_fffffffffffffde0);
  this_00 = (TPZTensor<double> *)0x4008000000000000;
  dVar2 = sqrt(3.0);
  local_1a8 = dVar2 * (double)this_00 * (double)pTVar3;
  dVar2 = sqrt((double)this_01 * (double)this_01 * (double)this_01);
  local_1a8 = local_1a8 / (dVar2 + dVar2);
  RVar1 = TPZExtractVal::val(local_1a8);
  if (RVar1 <= -1.0) {
    local_1a8 = local_1a8 * 0.999;
  }
  tensor = (TPZTensor<double> *)TPZExtractVal::val(local_1a8);
  if (1.0 <= (double)tensor) {
    local_1a8 = local_1a8 * 0.999;
  }
  Multiply<double,int>(this_00,(double *)tensor,(int *)in_stack_fffffffffffffde0);
  Multiply<double,int>(this_00,(double *)tensor,(int *)in_stack_fffffffffffffde0);
  Add<double,int>(this_00,tensor,(int *)in_stack_fffffffffffffde0);
  local_1d0 = ((double)pTVar3 * 9.0 * (double)pTVar3) /
              ((double)this_01 * (double)this_01 * (double)this_01);
  pTVar3 = (TPZTensor<double> *)TPZExtractVal::val(local_1d0);
  if (1.3333333333333333 <= (double)pTVar3) {
    local_1d0 = local_1d0 * 0.999;
  }
  dVar2 = sqrt((double)this_01 * (double)this_01 * (double)this_01 * (double)this_01 *
               (double)this_01);
  multipl = (double *)(dVar2 + dVar2);
  sqrt(1.3333333333333333 - local_1d0);
  Multiply<double,int>(this_00,(double *)tensor,(int *)pTVar3);
  operator*=(pTVar3,multipl);
  dVar2 = acos(local_1a8);
  *in_RDX = dVar2 / 3.0;
  RVar1 = TPZExtractVal::val(*in_RDX);
  if (1.0470975511965976 <= RVar1) {
    *in_RDX = *in_RDX * 0.999;
  }
  ~TPZTensor((TPZTensor<double> *)0x14a90c9);
  ~TPZTensor((TPZTensor<double> *)0x14a90d6);
  ~TPZTensor((TPZTensor<double> *)0x14a90e3);
  ~TPZTensor((TPZTensor<double> *)0x14a90f0);
  return;
}

Assistant:

void TPZTensor<T>::Lodeangle(TPZTensor<T> &GradLode, T &Lode)const {
    T J2t(this->J2());
    T J3t(this->J3());

    if (fabs(TPZExtractVal::val(J2t)) < 1.e-6)J2t = T(1.e-6);
    T sqrtJ2t = sqrt(J2t);
    if (fabs(TPZExtractVal::val(sqrtJ2t)) < 1.e-6)sqrtJ2t = T(1.e-6);

    TPZTensor<T> dJ2t, dJ3t;

    this->dJ2(dJ2t);
    this->dJ3(dJ3t);
    // Derivatives with respect to I1, J2 and J3

    TPZTensor<T> dLodeAngle, TempTensor;

    //QUAL DOS DOIS?
    //T theta =-asin( ( T( 3.) * sqrt( T( 3.) ) * J3t ) /( T( 2.) *  sqrt(J2t*J2t*J2t) ) )/T( 3.);
    //O GRADIENTE DO LODE ESTA EM FUNCAO DO LODE DE 0 a Pi/3


    T lodetemp = (T(3.) * sqrt(T(3.)) * J3t) / (T(2.) * sqrt(J2t * J2t * J2t));
    if (TPZExtractVal::val(lodetemp) <= -1.) {
        lodetemp *= T(0.999); //	DebugStop();
        // TPZExtractVal::val(lodetemp) *= T(0.999);	//	DebugStop();
        //lodetemp = T(-1.);

    }


    //cout << "\n lodetemp "<<lodetemp<<endl;
    //cout << "\n TPZExtractVal::val(lodetemp);"<<TPZExtractVal::val(lodetemp)<<endl;

    if (TPZExtractVal::val(lodetemp) >= 1.) {
        lodetemp *= T(0.999);
        // TPZExtractVal::val(lodetemp)*= 0.999;
        // lodetemp = T(1.);
        //DebugStop();
    }

    //DLODE = (-2*Dj3*j2 + 3*Dj2*J3t)/(2.*pow(J2t,2.5)*sqrt(1.3333333333333333 - (9*pow(J3t,2))/pow(J2t,3)))
    //1
    T j33 = T(3.) * J3t;
    dJ2t.Multiply(j33, 1);
    //2
    T j22 = T(2.) * J2t;
    dJ3t.Multiply(j22, 1);
    //3
    dJ2t.Add(dJ3t, -1);
    //4
    //if(TPZExtractVal::val(J2t)<1.e-6)J2t=1.e-6;
    T checknegativeroot = ((T(9.) * J3t * J3t) / (J2t * J2t * J2t));
    if (TPZExtractVal::val(checknegativeroot) >= 4 / 3.)checknegativeroot *= T(0.999);
    T denom = T(2.) * sqrt(J2t * J2t * J2t * J2t * J2t) * sqrt((T(4 / 3.)) - checknegativeroot);
    //T denom2 = (T(2.)*pow(J2t,2.5)*sqrt(T(1.3333333333333333) - (T(9.)*pow(J3t,2.))/pow(J2t,3)));
    T oneoverden = T(1.) / denom;
    dJ2t.Multiply(oneoverden, 1);
    dJ2t *= oneoverden;
    //    GradLode = dJ2t;

    T acoslodetemp = acos(lodetemp);
    Lode = acoslodetemp / T(3.);

    if (TPZExtractVal::val(Lode) >= (M_PI / 3.) - 0.0001) {
        Lode *= T(0.999);
    }
}